

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error-after-write.c
# Opt level: O2

int run_test_tcp_connect_error_after_write(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_250;
  uv_buf_t local_240;
  sockaddr_in addr;
  uv_tcp_t conn;
  uv_write_t write_req;
  uv_connect_t connect_req;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    local_240 = uv_buf_init("TEST",4);
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&conn);
    if (iVar1 == 0) {
      iVar1 = uv_write(&write_req,(uv_stream_t *)&conn,&local_240,1,write_cb);
      if (iVar1 == -9) {
        iVar1 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&addr,connect_cb);
        if (iVar1 == 0) {
          iVar1 = uv_write(&write_req,(uv_stream_t *)&conn,&local_240,1,write_cb);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            if (iVar1 == 0) {
              if (connect_cb_called == 1) {
                if (write_cb_called == 1) {
                  if (close_cb_called == 1) {
                    puVar2 = uv_default_loop();
                    uv_walk(puVar2,close_walk_cb,(void *)0x0);
                    uv_run(puVar2,UV_RUN_DEFAULT);
                    puVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(puVar2);
                    if (iVar1 == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                    uStack_250 = 0x60;
                  }
                  else {
                    pcVar3 = "close_cb_called == 1";
                    uStack_250 = 0x5e;
                  }
                }
                else {
                  pcVar3 = "write_cb_called == 1";
                  uStack_250 = 0x5d;
                }
              }
              else {
                pcVar3 = "connect_cb_called == 1";
                uStack_250 = 0x5c;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_250 = 0x5a;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_250 = 0x57;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_250 = 0x54;
        }
      }
      else {
        pcVar3 = "r == UV_EBADF";
        uStack_250 = 0x4e;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_250 = 0x4b;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_250 = 0x47;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
          ,uStack_250,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_connect_error_after_write) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t conn;
  uv_buf_t buf;
  int r;

#ifdef _WIN32
  fprintf(stderr, "This test is disabled on Windows for now.\n");
  fprintf(stderr, "See https://github.com/joyent/libuv/issues/444\n");
  return 0; /* windows slackers... */
#endif

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  buf = uv_buf_init("TEST", 4);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == UV_EBADF);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}